

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

int SUNNonlinSolSolve_FixedPoint
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector ycor,N_Vector w,sunrealtype tol,
              int callSetup,void *mem)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RDI;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  N_Vector delta;
  N_Vector gy;
  N_Vector yprev;
  int retval;
  SUNContext_conflict sunctx_local_scope_;
  int in_stack_0000007c;
  N_Vector in_stack_00000080;
  N_Vector in_stack_00000088;
  N_Vector in_stack_00000090;
  SUNNonlinearSolver in_stack_00000098;
  
  uVar1 = *(undefined8 *)(*in_RDI + 0x68);
  uVar2 = *(undefined8 *)(*in_RDI + 0x70);
  uVar3 = *(undefined8 *)(*in_RDI + 0x88);
  *(undefined8 *)(*in_RDI + 0x98) = 0;
  *(undefined8 *)(*in_RDI + 0xa0) = 0;
  *(undefined4 *)(*in_RDI + 0x90) = 0;
  while( true ) {
    if (*(int *)(*in_RDI + 0x94) <= *(int *)(*in_RDI + 0x90)) {
      *(long *)(*in_RDI + 0xa0) = *(long *)(*in_RDI + 0xa0) + 1;
      return 0x386;
    }
    N_VScale(0x3ff0000000000000,in_RDX,uVar1);
    iVar4 = (**(code **)*in_RDI)(in_RDX,uVar2,in_R9);
    if (iVar4 != 0) break;
    if (*(int *)(*in_RDI + 0x10) == 0) {
      N_VScale(0x3ff0000000000000,uVar2,in_RDX);
    }
    else {
      AndersonAccelerate(in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080,
                         in_stack_0000007c);
    }
    *(long *)(*in_RDI + 0x98) = *(long *)(*in_RDI + 0x98) + 1;
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,in_RDX,uVar1,uVar3);
    iVar4 = (**(code **)(*in_RDI + 8))
                      (in_XMM0_Qa,in_RDI,in_RDX,uVar3,in_RCX,*(undefined8 *)(*in_RDI + 0xa8));
    if (iVar4 == 0) {
      return 0;
    }
    if (iVar4 != 0x385) {
      *(long *)(*in_RDI + 0xa0) = *(long *)(*in_RDI + 0xa0) + 1;
      return iVar4;
    }
    *(int *)(*in_RDI + 0x90) = *(int *)(*in_RDI + 0x90) + 1;
  }
  return iVar4;
}

Assistant:

int SUNNonlinSolSolve_FixedPoint(SUNNonlinearSolver NLS,
                                 SUNDIALS_MAYBE_UNUSED N_Vector y0,
                                 N_Vector ycor, N_Vector w, sunrealtype tol,
                                 SUNDIALS_MAYBE_UNUSED sunbooleantype callSetup,
                                 void* mem)
{
  SUNFunctionBegin(NLS->sunctx);
  /* local variables */
  int retval;
  N_Vector yprev, gy, delta;

  /* check that all required function pointers have been set */
  SUNAssert(FP_CONTENT(NLS)->Sys && FP_CONTENT(NLS)->CTest, SUN_ERR_ARG_CORRUPT);

  /* set local shortcut variables */
  yprev = FP_CONTENT(NLS)->yprev;
  gy    = FP_CONTENT(NLS)->gy;
  delta = FP_CONTENT(NLS)->delta;

  /* initialize iteration and convergence fail counters for this solve */
  FP_CONTENT(NLS)->niters     = 0;
  FP_CONTENT(NLS)->nconvfails = 0;

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
                     "SUNNonlinSolSolve_FixedPoint", "begin-iteration",
                     "iter = %ld, nni = %ld", (long int)0,
                     FP_CONTENT(NLS)->niters);
#endif

  /* Looping point for attempts at solution of the nonlinear system:
       Evaluate fixed-point function (store in gy).
       Performs the accelerated fixed-point iteration.
       Performs stopping tests. */
  for (FP_CONTENT(NLS)->curiter = 0;
       FP_CONTENT(NLS)->curiter < FP_CONTENT(NLS)->maxiters;
       FP_CONTENT(NLS)->curiter++)
  {
    /* update previous solution guess */
    N_VScale(ONE, ycor, yprev);
    SUNCheckLastErr();

    /* Compute fixed-point iteration function, store in gy.
       We do not use SUNCheck macros here because Sys is an integrator-provided
       callback and returns integrator specific error values  where 0 == success,
       < 0 is a failure, > 0 is recoverable error. */
    retval = FP_CONTENT(NLS)->Sys(ycor, gy, mem);
    if (retval != 0) { return retval; }

    /* perform fixed point update, based on choice of acceleration or not */
    if (FP_CONTENT(NLS)->m == 0)
    { /* basic fixed-point solver */
      N_VScale(ONE, gy, ycor);
      SUNCheckLastErr();
    }
    else
    { /* Anderson-accelerated solver */
      SUNCheckCall(
        AndersonAccelerate(NLS, gy, ycor, yprev, FP_CONTENT(NLS)->curiter));
    }

    /* increment nonlinear solver iteration counter */
    FP_CONTENT(NLS)->niters++;

    /* compute change in solution, and call the convergence test function */
    N_VLinearSum(ONE, ycor, -ONE, yprev, delta);
    SUNCheckLastErr();

    /* test for convergence */
    retval = FP_CONTENT(NLS)->CTest(NLS, ycor, delta, tol, w,
                                    FP_CONTENT(NLS)->ctest_data);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
                       "SUNNonlinSolSolve_FixedPoint", "end-of-iterate",
                       "iter = %ld, nni = %ld, wrmsnorm = %.16g",
                       (long int)FP_CONTENT(NLS)->curiter,
                       FP_CONTENT(NLS)->niters, N_VWrmsNorm(delta, w));
#endif

    /* return if successful */
    if (retval == 0) { return SUN_SUCCESS; }

    /* check if the iterations should continue; otherwise increment the
       convergence failure count and return error flag */
    if (retval != SUN_NLS_CONTINUE)
    {
      FP_CONTENT(NLS)->nconvfails++;
      return (retval);
    }
  }

  /* if we've reached this point, then we exhausted the iteration limit;
     increment the convergence failure count and return */
  FP_CONTENT(NLS)->nconvfails++;
  return SUN_NLS_CONV_RECVR;
}